

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O3

TestStatus *
vkt::wsi::anon_unknown_0::createSurfaceCustomAllocatorTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkInstance *ppVVar1;
  TestLog *log;
  bool bVar2;
  VkAllocationCallbacks *pVVar3;
  char *pcVar4;
  AllocationCallbackRecorder allocationRecorder;
  InstanceHelper instHelper;
  Maybe<tcu::Vector<unsigned_int,_2>_> local_2a8;
  VkInstance local_298;
  VkAllocationCallbacks *pVStack_290;
  Move<vk::Handle<(vk::HandleType)25>_> local_288;
  AllocationCallbackRecorder local_268;
  NativeObjects local_208;
  undefined1 local_1e8 [24];
  VkInstance_s *local_1d0;
  DestroyInstanceFunc p_Stack_1c8;
  VkAllocationCallbacks *local_1c0;
  InstanceDriver local_1b8;
  
  pVVar3 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_268,pVVar3,0x400);
  log = context->m_testCtx->m_log;
  pVVar3 = &local_268.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  InstanceHelper::InstanceHelper((InstanceHelper *)local_1e8,context,wsiType,pVVar3);
  local_2a8.m_ptr = (Vector<unsigned_int,_2> *)0x0;
  NativeObjects::NativeObjects
            (&local_208,(Context *)context->m_testCtx->m_platform,(Extensions *)local_1e8,wsiType,
             &local_2a8);
  ::vk::wsi::createSurface
            (&local_288,&local_1b8.super_InstanceInterface,local_1d0,wsiType,
             local_208.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_208.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             pVVar3);
  local_298 = local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instance;
  pVStack_290 = local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator;
  local_2a8.m_ptr =
       (Vector<unsigned_int,_2> *)
       local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal;
  local_2a8.field_1.m_align =
       (deUint64)
       local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instanceIface;
  bVar2 = ::vk::validateAndLog(log,&local_268,0x12);
  if (bVar2) {
    if (local_2a8.m_ptr != (Vector<unsigned_int,_2> *)0x0) {
      (**(code **)(*(long *)local_2a8.field_1 + 0x68))
                (local_2a8.field_1.m_align,local_298,local_2a8.m_ptr,pVStack_290);
    }
    (*(local_208.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
       m_data.ptr)->_vptr_Window[1])
              (local_208.window.
               super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr);
    (**(code **)(*(long *)local_208.display.
                          super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
                          m_data.ptr + 8))
              (local_208.display.
               super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr)
    ;
    ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
    if (local_1d0 != (VkInstance)0x0) {
      (*p_Stack_1c8)(local_1d0,local_1c0);
    }
    local_1d0 = (VkInstance_s *)0x0;
    p_Stack_1c8 = (DestroyInstanceFunc)0x0;
    local_1c0 = (VkAllocationCallbacks *)0x0;
    if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
    }
    bVar2 = ::vk::validateAndLog(log,&local_268,0);
    if (bVar2) {
      if ((local_268.m_records.m_first == local_268.m_records.m_last) &&
         (local_268.m_records.m_numElements % local_268.m_records.m_blockSize == 0)) {
        local_1e8._0_8_ = local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"Allocation callbacks were not used","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_1e8._0_8_,
                   (char *)local_1e8._8_8_ + local_1e8._0_8_);
      }
      else {
        local_1e8._0_8_ = local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"Creating surface succeeded using custom allocator","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_1e8._0_8_,
                   (char *)local_1e8._8_8_ + local_1e8._0_8_);
      }
    }
    else {
      local_1e8._0_8_ = local_1e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"Detected invalid system allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1e8._0_8_,
                 (char *)local_1e8._8_8_ + local_1e8._0_8_);
    }
    if ((pointer)local_1e8._0_8_ == (pointer)(local_1e8 + 0x10)) goto LAB_007145b8;
    pcVar4 = (char *)local_1e8._16_8_ + 1;
  }
  else {
    ppVVar1 = &local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instance;
    local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal =
         (deUint64)ppVVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_288,"Detected invalid system allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.
                       m_instanceIface)->_vptr_InstanceInterface +
               local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal));
    if ((VkInstance *)
        local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal != ppVVar1
       ) {
      operator_delete((void *)local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object
                              .m_internal,
                      (ulong)(local_288.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.
                              deleter.m_instance + 1));
    }
    if (local_2a8.m_ptr != (Vector<unsigned_int,_2> *)0x0) {
      (**(code **)(*(long *)local_2a8.field_1 + 0x68))
                (local_2a8.field_1.m_align,local_298,local_2a8.m_ptr,pVStack_290);
    }
    (*(local_208.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
       m_data.ptr)->_vptr_Window[1])
              (local_208.window.
               super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr);
    (**(code **)(*(long *)local_208.display.
                          super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
                          m_data.ptr + 8))
              (local_208.display.
               super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr)
    ;
    ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
    if (local_1d0 != (VkInstance)0x0) {
      (*p_Stack_1c8)(local_1d0,local_1c0);
    }
    local_1d0 = (VkInstance_s *)0x0;
    p_Stack_1c8 = (DestroyInstanceFunc)0x0;
    local_1c0 = (VkAllocationCallbacks *)0x0;
    if ((pointer)local_1e8._0_8_ == (pointer)0x0) goto LAB_007145b8;
    pcVar4 = (char *)(local_1e8._16_8_ - local_1e8._0_8_);
  }
  operator_delete((void *)local_1e8._0_8_,(ulong)pcVar4);
LAB_007145b8:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_268);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSurfaceCustomAllocatorTest (Context& context, Type wsiType)
{
	AllocationCallbackRecorder	allocationRecorder	(getSystemAllocator());
	tcu::TestLog&				log					= context.getTestContext().getLog();

	{
		const InstanceHelper		instHelper	(context, wsiType, allocationRecorder.getCallbacks());
		const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
		const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki,
															   *instHelper.instance,
															   wsiType,
															   *native.display,
															   *native.window,
															   allocationRecorder.getCallbacks()));

		if (!validateAndLog(log,
							allocationRecorder,
							(1u<<VK_SYSTEM_ALLOCATION_SCOPE_OBJECT)		|
							(1u<<VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)))
			return tcu::TestStatus::fail("Detected invalid system allocation callback");
	}

	if (!validateAndLog(log, allocationRecorder, 0u))
		return tcu::TestStatus::fail("Detected invalid system allocation callback");

	if (allocationRecorder.getRecordsBegin() == allocationRecorder.getRecordsEnd())
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks were not used");
	else
		return tcu::TestStatus::pass("Creating surface succeeded using custom allocator");
}